

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_thunder.c
# Opt level: O3

int ThunderDecodeRow(TIFF *tif,uint8_t *buf,tmsize_t occ,uint16_t s)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  
  if (occ % tif->tif_scanlinesize == 0) {
    iVar5 = 1;
    if (0 < occ) {
      pbVar1 = tif->tif_rawcp;
      lVar2 = tif->tif_rawcc;
      do {
        uVar8 = (ulong)(tif->tif_dir).td_imagewidth;
        if (0 < lVar2 && uVar8 != 0) {
          iVar5 = (*(code *)(&DAT_00333510 + *(int *)(&DAT_00333510 + (ulong)(*pbVar1 >> 6) * 4)))
                            (lVar2,buf);
          return iVar5;
        }
        tif->tif_rawcp = pbVar1;
        tif->tif_rawcc = lVar2;
        if (uVar8 != 0) {
          pcVar6 = "Too much";
          if (uVar8 != 0) {
            pcVar6 = "Not enough";
          }
          TIFFErrorExtR(tif,"ThunderDecode","%s data at scanline %lu (%lu != %lu)",pcVar6,
                        (ulong)tif->tif_row,0,uVar8);
          return 0;
        }
        lVar3 = tif->tif_scanlinesize;
        buf = buf + lVar3;
        lVar7 = occ - lVar3;
        bVar4 = lVar3 <= occ;
        occ = lVar7;
      } while (lVar7 != 0 && bVar4);
      iVar5 = 1;
    }
  }
  else {
    iVar5 = 0;
    TIFFErrorExtR(tif,"ThunderDecodeRow","Fractional scanlines cannot be read");
  }
  return iVar5;
}

Assistant:

static int ThunderDecodeRow(TIFF *tif, uint8_t *buf, tmsize_t occ, uint16_t s)
{
    static const char module[] = "ThunderDecodeRow";
    uint8_t *row = buf;

    (void)s;
    if (occ % tif->tif_scanlinesize)
    {
        TIFFErrorExtR(tif, module, "Fractional scanlines cannot be read");
        return (0);
    }
    while (occ > 0)
    {
        if (!ThunderDecode(tif, row, tif->tif_dir.td_imagewidth))
            return (0);
        occ -= tif->tif_scanlinesize;
        row += tif->tif_scanlinesize;
    }
    return (1);
}